

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.hpp
# Opt level: O0

Color __thiscall Gradient::evaluate(Gradient *this,float pos)

{
  float fVar1;
  float fVar2;
  float fVar3;
  bool bVar4;
  const_reference pvVar5;
  pointer pSVar6;
  Color local_7c;
  Color local_6c;
  float local_5c;
  __normal_iterator<const_Gradient::Stop_*,_std::vector<Gradient::Stop,_std::allocator<Gradient::Stop>_>_>
  _Stack_58;
  float factor;
  __normal_iterator<const_Gradient::Stop_*,_std::vector<Gradient::Stop,_std::allocator<Gradient::Stop>_>_>
  i0;
  __normal_iterator<const_Gradient::Stop_*,_std::vector<Gradient::Stop,_std::allocator<Gradient::Stop>_>_>
  local_48;
  Stop *local_40;
  __normal_iterator<const_Gradient::Stop_*,_std::vector<Gradient::Stop,_std::allocator<Gradient::Stop>_>_>
  local_38;
  __normal_iterator<const_Gradient::Stop_*,_std::vector<Gradient::Stop,_std::allocator<Gradient::Stop>_>_>
  local_30;
  __normal_iterator<const_Gradient::Stop_*,_std::vector<Gradient::Stop,_std::allocator<Gradient::Stop>_>_>
  i;
  float pos_local;
  Gradient *this_local;
  
  i._M_current._4_4_ = pos;
  bVar4 = std::vector<Gradient::Stop,_std::allocator<Gradient::Stop>_>::empty(&this->stops);
  if (bVar4) {
    Color::Color((Color *)&this_local);
  }
  else {
    local_38._M_current =
         (Stop *)std::vector<Gradient::Stop,_std::allocator<Gradient::Stop>_>::begin(&this->stops);
    local_40 = (Stop *)std::vector<Gradient::Stop,_std::allocator<Gradient::Stop>_>::end
                                 (&this->stops);
    local_30 = std::
               lower_bound<__gnu_cxx::__normal_iterator<Gradient::Stop_const*,std::vector<Gradient::Stop,std::allocator<Gradient::Stop>>>,float>
                         (local_38,(__normal_iterator<const_Gradient::Stop_*,_std::vector<Gradient::Stop,_std::allocator<Gradient::Stop>_>_>
                                    )local_40,(float *)((long)&i._M_current + 4));
    local_48._M_current =
         (Stop *)std::vector<Gradient::Stop,_std::allocator<Gradient::Stop>_>::begin(&this->stops);
    bVar4 = __gnu_cxx::operator==(&local_30,&local_48);
    if (bVar4) {
      pvVar5 = std::vector<Gradient::Stop,_std::allocator<Gradient::Stop>_>::front(&this->stops);
      _this_local = pvVar5->color;
    }
    else {
      i0._M_current =
           (Stop *)std::vector<Gradient::Stop,_std::allocator<Gradient::Stop>_>::end(&this->stops);
      bVar4 = __gnu_cxx::operator==(&local_30,&i0);
      if (bVar4) {
        pvVar5 = std::vector<Gradient::Stop,_std::allocator<Gradient::Stop>_>::back(&this->stops);
        _this_local = pvVar5->color;
      }
      else {
        _Stack_58 = __gnu_cxx::
                    __normal_iterator<const_Gradient::Stop_*,_std::vector<Gradient::Stop,_std::allocator<Gradient::Stop>_>_>
                    ::operator-(&local_30,1);
        fVar3 = i._M_current._4_4_;
        pSVar6 = __gnu_cxx::
                 __normal_iterator<const_Gradient::Stop_*,_std::vector<Gradient::Stop,_std::allocator<Gradient::Stop>_>_>
                 ::operator->(&stack0xffffffffffffffa8);
        fVar1 = pSVar6->pos;
        pSVar6 = __gnu_cxx::
                 __normal_iterator<const_Gradient::Stop_*,_std::vector<Gradient::Stop,_std::allocator<Gradient::Stop>_>_>
                 ::operator->(&local_30);
        fVar2 = pSVar6->pos;
        pSVar6 = __gnu_cxx::
                 __normal_iterator<const_Gradient::Stop_*,_std::vector<Gradient::Stop,_std::allocator<Gradient::Stop>_>_>
                 ::operator->(&stack0xffffffffffffffa8);
        local_5c = (fVar3 - fVar1) / (fVar2 - pSVar6->pos);
        pSVar6 = __gnu_cxx::
                 __normal_iterator<const_Gradient::Stop_*,_std::vector<Gradient::Stop,_std::allocator<Gradient::Stop>_>_>
                 ::operator->(&stack0xffffffffffffffa8);
        local_6c = Color::operator*(&pSVar6->color,1.0 - local_5c);
        pSVar6 = __gnu_cxx::
                 __normal_iterator<const_Gradient::Stop_*,_std::vector<Gradient::Stop,_std::allocator<Gradient::Stop>_>_>
                 ::operator->(&local_30);
        local_7c = Color::operator*(&pSVar6->color,local_5c);
        _this_local = Color::operator+(&local_6c,&local_7c);
      }
    }
  }
  return _this_local;
}

Assistant:

Color evaluate(float pos) const {
		// the stops need to be sorted
		if (stops.empty()) {
			return Color();
		}
		const auto i = std::lower_bound(stops.begin(), stops.end(), pos);
		if (i == stops.begin()) {
			return stops.front().color;
		}
		if (i == stops.end()) {
			return stops.back().color;
		}
		const auto i0 = i - 1;
		const float factor = (pos - i0->pos) / (i->pos - i0->pos);
		return i0->color * (1.f - factor) + i->color * factor;
	}